

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::GenVarsT::GenVarsT(GenVarsT *this,GenT gen)

{
  string_view sVar1;
  
  this->Enabled = false;
  this->Gen = gen;
  sVar1 = cmQtAutoGen::GeneratorNameUpper(gen);
  this->GenNameUpper = sVar1;
  (this->ExecutableTargetName)._M_dataplus._M_p = (pointer)&(this->ExecutableTargetName).field_2;
  (this->ExecutableTargetName)._M_string_length = 0;
  (this->ExecutableTargetName).field_2._M_local_buf[0] = '\0';
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  cmQtAutoGen::ConfigString::ConfigString(&this->Executable);
  (this->ExecutableFeatures).Default.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ExecutableFeatures).Default.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ExecutableFeatures).Config._M_h._M_buckets =
       &(this->ExecutableFeatures).Config._M_h._M_single_bucket;
  (this->ExecutableFeatures).Config._M_h._M_bucket_count = 1;
  (this->ExecutableFeatures).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ExecutableFeatures).Config._M_h._M_element_count = 0;
  (this->ExecutableFeatures).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ExecutableFeatures).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ExecutableFeatures).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

GenVarsT(GenT gen)
      : Gen(gen)
      , GenNameUpper(cmQtAutoGen::GeneratorNameUpper(gen))
    {
    }